

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

void __thiscall
QSocks5SocketEnginePrivate::_q_controlSocketBytesWritten(QSocks5SocketEnginePrivate *this)

{
  long lVar1;
  
  if ((this->socks5State == Connected) &&
     (((this->mode != ConnectMode ||
       (lVar1 = (**(code **)(*(long *)&this->data->controlSocket->super_QAbstractSocket + 0xa8))(),
       lVar1 == 0)) &&
      (lVar1 = (**(code **)(*(long *)&this->data->controlSocket->super_QAbstractSocket + 0xa8))(),
      lVar1 < 0x20000)))) {
    emitWriteNotification(this);
    this->writeNotificationActivated = false;
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::_q_controlSocketBytesWritten()
{
    QSOCKS5_DEBUG << "_q_controlSocketBytesWritten";

    if (socks5State != Connected
        || (mode == ConnectMode
        && data->controlSocket->bytesToWrite()))
        return;
    if (data->controlSocket->bytesToWrite() < MaxWriteBufferSize) {
        emitWriteNotification();
        writeNotificationActivated = false;
    }
}